

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

void add_child_node(trie_node *parent,trie_node *child,child_node_rel rel)

{
  long lVar1;
  long in_FS_OFFSET;
  child_node_rel rel_local;
  trie_node *child_local;
  trie_node *parent_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((rel != LEFT) && (rel != RIGHT)) {
    __assert_fail("rel == LEFT || rel == RIGHT",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie.c"
                  ,0x27,
                  "void add_child_node(struct trie_node *, struct trie_node *, enum child_node_rel)"
                 );
  }
  if (rel == LEFT) {
    parent->lchild = child;
  }
  else {
    parent->rchild = child;
  }
  child->parent = parent;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void add_child_node(struct trie_node *parent, struct trie_node *child, enum child_node_rel rel)
{
	assert(rel == LEFT || rel == RIGHT);

	if (rel == LEFT)
		parent->lchild = child;
	else
		parent->rchild = child;

	child->parent = parent;
}